

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O0

int xsdTest(void)

{
  int iVar1;
  long lVar2;
  xmlNodePtr cur_00;
  int local_2c;
  int ret;
  char *filename;
  xmlNodePtr cur;
  xmlDocPtr doc;
  
  local_2c = 0;
  lVar2 = xmlReadFile("test/xsdtest/xsdtestsuite.xml",0,2);
  if (lVar2 == 0) {
    fprintf(_stderr,"Failed to parse %s\n","test/xsdtest/xsdtestsuite.xml");
    doc._4_4_ = -1;
  }
  else {
    printf("## XML Schemas datatypes test suite from James Clark\n");
    cur_00 = (xmlNodePtr)xmlDocGetRootElement(lVar2);
    if ((cur_00 == (xmlNodePtr)0x0) || (iVar1 = xmlStrEqual(cur_00->name,"testSuite"), iVar1 == 0))
    {
      fprintf(_stderr,"Unexpected format %s\n","test/xsdtest/xsdtestsuite.xml");
      local_2c = -1;
    }
    else {
      filename = (char *)getNext(cur_00,"./testSuite[1]");
      if (((xmlNodePtr)filename == (xmlNodePtr)0x0) ||
         (iVar1 = xmlStrEqual(((xmlNodePtr)filename)->name,"testSuite"), iVar1 == 0)) {
        fprintf(_stderr,"Unexpected format %s\n","test/xsdtest/xsdtestsuite.xml");
        local_2c = -1;
      }
      else {
        for (; filename != (char *)0x0;
            filename = (char *)getNext((xmlNodePtr)filename,"following-sibling::testSuite[1]")) {
          xsdTestSuite((xmlNodePtr)filename);
        }
      }
    }
    if (lVar2 != 0) {
      xmlFreeDoc(lVar2);
    }
    doc._4_4_ = local_2c;
  }
  return doc._4_4_;
}

Assistant:

static int
xsdTest(void) {
    xmlDocPtr doc;
    xmlNodePtr cur;
    const char *filename = "test/xsdtest/xsdtestsuite.xml";
    int ret = 0;

    doc = xmlReadFile(filename, NULL, XML_PARSE_NOENT);
    if (doc == NULL) {
        fprintf(stderr, "Failed to parse %s\n", filename);
	return(-1);
    }
    printf("## XML Schemas datatypes test suite from James Clark\n");

    cur = xmlDocGetRootElement(doc);
    if ((cur == NULL) || (!xmlStrEqual(cur->name, BAD_CAST "testSuite"))) {
        fprintf(stderr, "Unexpected format %s\n", filename);
	ret = -1;
	goto done;
    }

    cur = getNext(cur, "./testSuite[1]");
    if ((cur == NULL) || (!xmlStrEqual(cur->name, BAD_CAST "testSuite"))) {
        fprintf(stderr, "Unexpected format %s\n", filename);
	ret = -1;
	goto done;
    }
    while (cur != NULL) {
        xsdTestSuite(cur);
	cur = getNext(cur, "following-sibling::testSuite[1]");
    }

done:
    if (doc != NULL)
	xmlFreeDoc(doc);
    return(ret);
}